

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConeShape.cpp
# Opt level: O2

void __thiscall chrono::ChConeShape::ArchiveIN(ChConeShape *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::geometry::ChCone> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChConeShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_28._value = &this->gcone;
  local_28._name = "gcone";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChConeShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChConeShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gcone);
}